

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

attack * getmattk(permonst *mptr,int indx,int *prev_result,attack *alt_attk_buf)

{
  attack *local_30;
  attack *attk;
  attack *alt_attk_buf_local;
  int *prev_result_local;
  int indx_local;
  permonst *mptr_local;
  
  local_30 = mptr->mattk + indx;
  if ((((0 < indx) && (0 < prev_result[indx + -1])) &&
      ((local_30->adtyp == '!' || ((local_30->adtyp == '&' || (local_30->adtyp == '\'')))))) &&
     (local_30->adtyp == mptr->mattk[indx + -1].adtyp)) {
    *alt_attk_buf = *local_30;
    alt_attk_buf->adtyp = '\f';
    local_30 = alt_attk_buf;
  }
  return local_30;
}

Assistant:

const struct attack *getmattk(const struct permonst *mptr, int indx, int prev_result[],
			struct attack *alt_attk_buf)
{
    const struct attack *attk = &mptr->mattk[indx];

    /* prevent a monster with two consecutive disease or hunger attacks
       from hitting with both of them on the same turn; if the first has
       already hit, switch to a stun attack for the second */
    if (indx > 0 && prev_result[indx - 1] > 0 &&
	    (attk->adtyp == AD_DISE ||
		attk->adtyp == AD_PEST ||
		attk->adtyp == AD_FAMN) &&
	    attk->adtyp == mptr->mattk[indx - 1].adtyp) {
	*alt_attk_buf = *attk;
	alt_attk_buf->adtyp = AD_STUN;
	attk = alt_attk_buf;
    }
    return attk;
}